

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SColor.h
# Opt level: O0

u16 irr::video::A8R8G8B8toA1R5G5B5(u32 color)

{
  u32 color_local;
  
  return (ushort)(color >> 0x10) & 0x8000 | (ushort)((color & 0xf80000) >> 9) |
         (ushort)((color & 0xf800) >> 6) | (ushort)((color & 0xf8) >> 3);
}

Assistant:

inline u16 A8R8G8B8toA1R5G5B5(u32 color)
{
	return (u16)((color & 0x80000000) >> 16 |
				 (color & 0x00F80000) >> 9 |
				 (color & 0x0000F800) >> 6 |
				 (color & 0x000000F8) >> 3);
}